

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.cpp
# Opt level: O1

Uri * Uri::Uri::file(Uri *__return_storage_ptr__,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  char *pcVar4;
  pointer pcVar5;
  long lVar6;
  char *pcVar7;
  string authority;
  string scheme;
  string empty;
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"file","");
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  uVar3 = path->_M_string_length;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (((uVar3 < 2) || (pcVar4 = (path->_M_dataplus)._M_p, *pcVar4 != '/')) || (pcVar4[1] != '/')) {
    Uri(__return_storage_ptr__,&local_70,&local_90,path,&local_50,&local_50);
  }
  else {
    if (uVar3 != 2) {
      lVar6 = uVar3 - 2;
      pcVar7 = pcVar4 + 2;
      do {
        if (*pcVar7 == '/') {
          local_b0[0] = local_a0;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)local_b0,pcVar4 + 2,pcVar7);
          std::__cxx11::string::operator=((string *)&local_90,(string *)local_b0);
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
          local_b0[0] = local_a0;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)local_b0,pcVar7,(path->_M_dataplus)._M_p + path->_M_string_length);
          std::__cxx11::string::operator=((string *)path,(string *)local_b0);
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
          if (path->_M_string_length == 0) {
            std::__cxx11::string::_M_replace((ulong)path,0,(char *)0x0,0x1eb1a6);
          }
          Uri(__return_storage_ptr__,&local_70,&local_90,path,&local_50,&local_50);
          goto LAB_00189cc5;
        }
        pcVar7 = pcVar7 + 1;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    pcVar5 = (path->_M_dataplus)._M_p;
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)local_b0,pcVar5 + 2,pcVar5 + path->_M_string_length);
    std::__cxx11::string::operator=((string *)&local_90,(string *)local_b0);
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    std::__cxx11::string::_M_replace((ulong)path,0,(char *)path->_M_string_length,0x1eb1a6);
    Uri(__return_storage_ptr__,&local_70,&local_90,path,&local_50,&local_50);
  }
LAB_00189cc5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Uri Uri::file (string path) {
    string scheme = "file";
    string empty {};
    string authority {};

    if (IS_WINDOWS) {
        forwardToBackslashes(path);
    }

    if (path.length() >= 2 && path[0] == '/' && path[1] == '/') {
        auto end = path.end();
        for (auto itr = path.begin() + 2; itr != end; itr++) {
            if (*itr == '/') {
                authority = string(path.begin() + 2, itr);
                path = string(itr, path.end());
                if (path.empty()) path = "/";

                return Uri { scheme, authority, path, empty, empty };
            }
        }

        authority = string(path.begin() + 2, path.end());
        path = "/";

        return Uri { scheme, authority, path, empty, empty };
    }

    return Uri { scheme, authority, path, empty, empty };
}